

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadScene(ColladaParser *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined4 extraout_var;
  char *__s;
  size_t sVar4;
  iterator iVar5;
  long *plVar6;
  size_type *psVar7;
  key_type local_a0;
  _Base_ptr local_80;
  NodeLibrary *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_00;
  
  iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if (((char)iVar1 == '\0') &&
     (iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])(), (char)iVar1 != '\0')) {
    local_78 = &this->mNodeLibrary;
    local_80 = &(this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar1 == 1) {
        if (iVar2 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar1 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar1 = strcmp((char *)CONCAT44(extraout_var,iVar1),"instance_visual_scene");
        if (iVar1 == 0) {
          if (this->mRootNode != (Node *)0x0) {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,
                       "Invalid scene containing multiple root nodes in <instance_visual_scene> element"
                       ,"");
            ThrowException(this,&local_a0);
          }
          uVar3 = GetAttribute(this,"url");
          iVar1 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar3);
          __s = (char *)CONCAT44(extraout_var_00,iVar1);
          if (*__s != '#') {
            local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a0,
                       "Unknown reference format in <instance_visual_scene> element","");
            ThrowException(this,&local_a0);
          }
          local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
          sVar4 = strlen(__s + 1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a0,__s + 1,__s + sVar4 + 1);
          iVar5 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Node_*>_>_>
                  ::find(&local_78->_M_t,&local_a0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
            operator_delete(local_a0._M_dataplus._M_p);
          }
          if (iVar5._M_node == local_80) {
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            sVar4 = strlen(__s);
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,__s,__s + sVar4);
            std::operator+(&local_50,"Unable to resolve visual_scene reference \"",&local_70);
            plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
            local_a0._M_dataplus._M_p = (pointer)*plVar6;
            psVar7 = (size_type *)(plVar6 + 2);
            if ((size_type *)local_a0._M_dataplus._M_p == psVar7) {
              local_a0.field_2._M_allocated_capacity = *psVar7;
              local_a0.field_2._8_8_ = plVar6[3];
              local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
            }
            else {
              local_a0.field_2._M_allocated_capacity = *psVar7;
            }
            local_a0._M_string_length = plVar6[1];
            *plVar6 = (long)psVar7;
            plVar6[1] = 0;
            *(undefined1 *)(plVar6 + 2) = 0;
            ThrowException(this,&local_a0);
          }
          this->mRootNode = *(Node **)(iVar5._M_node + 2);
        }
        else {
          SkipElement(this);
        }
      }
      else if (iVar2 == 2) {
        return;
      }
      iVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar1 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadScene()
{
    if (mReader->isEmptyElement())
        return;

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("instance_visual_scene"))
            {
                // should be the first and only occurrence
                if (mRootNode)
                    ThrowException("Invalid scene containing multiple root nodes in <instance_visual_scene> element");

                // read the url of the scene to instance. Should be of format "#some_name"
                int urlIndex = GetAttribute("url");
                const char* url = mReader->getAttributeValue(urlIndex);
                if (url[0] != '#')
                    ThrowException("Unknown reference format in <instance_visual_scene> element");

                // find the referred scene, skip the leading #
                NodeLibrary::const_iterator sit = mNodeLibrary.find(url + 1);
                if (sit == mNodeLibrary.end())
                    ThrowException("Unable to resolve visual_scene reference \"" + std::string(url) + "\" in <instance_visual_scene> element.");
                mRootNode = sit->second;
            }
            else {
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            break;
        }
    }
}